

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessEngine.cpp
# Opt level: O0

void senjo::ChessEngine::Timer(void *data)

{
  byte bVar1;
  bool bVar2;
  uint64_t uVar3;
  long lVar4;
  uint64_t uVar5;
  Output *pOVar6;
  unsigned_long *puVar7;
  double dVar8;
  Output local_b0 [2];
  exception *e;
  unsigned_long local_98;
  uint64_t msecs_1;
  uint64_t tmout;
  Output local_80;
  Output out;
  uint64_t end;
  uint64_t now;
  uint64_t qnodes;
  uint64_t nodes;
  uint64_t msecs;
  int seldepth;
  int movenum;
  int depth;
  char move [8];
  uint outputInterval;
  ChessEngine *engine;
  Output local_18;
  void *local_10;
  void *data_local;
  
  local_10 = data;
  if (data == (void *)0x0) {
    Output::Output(&local_18,InfoPrefix);
    Output::operator<<(&local_18,(char (*) [41])"ChessEngine::Timer() NULL data parameter");
    Output::~Output(&local_18);
  }
  else if (data == (void *)0x0) {
    Output::Output((Output *)(move + 4),InfoPrefix);
    Output::operator<<((Output *)(move + 4),
                       (char (*) [51])"ChessEngine::Timer() failed to cast data parameter");
    Output::~Output((Output *)(move + 4));
  }
  else {
    move._0_4_ = (**(code **)(*data + 0x98))();
    seldepth = 0;
    msecs._4_4_ = 0;
    msecs._0_4_ = 0;
    nodes = 0;
    qnodes = 0;
    now = 0;
    do {
      if (((_quit ^ 0xff) & 1) == 0) break;
      uVar3 = Now();
      out._vptr_Output = (_func_int **)(**(code **)(*data + 0xe8))();
      bVar1 = (**(code **)(*data + 0xd8))();
      if ((bVar1 & 1) != 0) {
        if ((out._vptr_Output == (_func_int **)0x0) ||
           ((_func_int **)(uVar3 + 100) < out._vptr_Output)) {
          lVar4 = (**(code **)(*data + 0x108))();
          if ((lVar4 == 0) && (uVar5 = Output::LastOutput(), uVar5 + (uint)move._0_4_ <= uVar3)) {
            (**(code **)(*data + 0x80))
                      (data,&seldepth,&msecs,&qnodes,&now,&nodes,(long)&msecs + 4,&movenum,8);
            Output::Output(&local_80,NoPrefix);
            pOVar6 = Output::operator<<(&local_80,(char (*) [12])"info depth ");
            pOVar6 = Output::operator<<(pOVar6,&seldepth);
            pOVar6 = Output::operator<<(pOVar6,(char (*) [11])" seldepth ");
            pOVar6 = Output::operator<<(pOVar6,(int *)&msecs);
            pOVar6 = Output::operator<<(pOVar6,(char (*) [8])" nodes ");
            pOVar6 = Output::operator<<(pOVar6,&qnodes);
            pOVar6 = Output::operator<<(pOVar6,(char (*) [7])" time ");
            pOVar6 = Output::operator<<(pOVar6,&nodes);
            pOVar6 = Output::operator<<(pOVar6,(char (*) [6])" nps ");
            dVar8 = Rate(qnodes,nodes);
            tmout = (long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f;
            Output::operator<<(pOVar6,&tmout);
            if (0 < msecs._4_4_) {
              pOVar6 = Output::operator<<(&local_80,(char (*) [17])" currmovenumber ");
              pOVar6 = Output::operator<<(pOVar6,(int *)((long)&msecs + 4));
              pOVar6 = Output::operator<<(pOVar6,(char (*) [11])" currmove ");
              Output::operator<<(pOVar6,(char (*) [8])&movenum);
            }
            Output::~Output(&local_80);
          }
        }
        else {
          (**(code **)(*data + 0xf8))(data,2);
        }
      }
      msecs_1 = (long)out._vptr_Output + (-100 - uVar3);
      e = (exception *)0x64;
      puVar7 = std::min<unsigned_long>((unsigned_long *)&e,&msecs_1);
      local_98 = *puVar7;
      bVar2 = MillisecondSleep((uint)local_98);
    } while (bVar2);
    if ((_debug & 1) != 0) {
      Output::Output(local_b0,InfoPrefix);
      Output::operator<<(local_b0,(char (*) [34])"ChessEngine::Timer thread exiting");
      Output::~Output(local_b0);
    }
  }
  return;
}

Assistant:

void ChessEngine::Timer(void* data)
{
  try {
    if (!data) {
      Output() << "ChessEngine::Timer() NULL data parameter";
      return;
    }

    ChessEngine* engine;
#ifdef NDEBUG
    engine = static_cast<ChessEngine*>(data);
#else
    engine = reinterpret_cast<ChessEngine*>(data);
    if (!engine) {
      Output() << "ChessEngine::Timer() failed to cast data parameter";
      return;
    }
#endif

    const unsigned int outputInterval = engine->TimerOutputInterval();

    char     move[8];
    int      depth = 0;
    int      movenum = 0;
    int      seldepth = 0;
    uint64_t msecs = 0;
    uint64_t nodes = 0;
    uint64_t qnodes = 0;

    while (!_quit) {
      const uint64_t now = Now();
      const uint64_t end = engine->GetStopTime();

      if (engine->IsSearching()) {
        if (end && ((now + 100) >= end)) {
          engine->Stop(StopReason::Timeout);
        }
        else if (!engine->TimeoutOccurred() &&
                 (now >= (Output::LastOutput() + outputInterval)))
        {
          engine->GetStats(&depth, &seldepth, &nodes, &qnodes, &msecs,
                           &movenum, move, sizeof(move));

          Output out(Output::NoPrefix);
          out << "info depth " << depth
              << " seldepth " << seldepth
              << " nodes " << nodes
              << " time " << msecs
              << " nps " << static_cast<uint64_t>(Rate(nodes, msecs));

          if (movenum > 0) {
            out << " currmovenumber " << movenum
                << " currmove " << move;
          }
        }
      }

      const uint64_t tmout = (end - now - 100);
      const uint64_t msecs = std::min<uint64_t>(100, tmout);
      if (!MillisecondSleep(static_cast<unsigned int>(msecs))) {
        break;
      }
    }
  }
  catch (std::exception& e) {
    std::cerr << "info string ChessEngine::Timer() ERROR: "
              << e.what() << std::endl;
  }
  catch (...) {
    std::cerr << "info string ChessEngine::Timer() ERROR: unknown exception"
              << std::endl;
  }

  if (_debug) {
    Output() << "ChessEngine::Timer thread exiting";
  }
}